

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

Gls_Man_t * Gls_ManAlloc(Vec_Str_t *vLines,int *pCounts)

{
  int iVar1;
  Gls_Man_t *pGVar2;
  Vec_Str_t *pVVar3;
  char *__s;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  word *pwVar7;
  Vec_Wec_t *pVVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t __n;
  
  pGVar2 = (Gls_Man_t *)calloc(1,0x88);
  pGVar2->vLines = vLines;
  iVar1 = vLines->nSize;
  __n = (long)iVar1 + 100;
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  iVar12 = (int)__n;
  iVar9 = 0x10;
  if (0xe < iVar1 + 99U) {
    iVar9 = iVar12;
  }
  pVVar3->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar9);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar12;
  memset(__s,0,__n);
  pGVar2->vTypes = pVVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar12;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar12;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,__n * 4);
    }
  }
  pGVar2->vIndexes = pVVar4;
  iVar1 = pCounts[7];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar9 = iVar1 * 4;
  if (iVar1 * 4 - 1U < 0xf) {
    iVar9 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vLut4s = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vLut4TTs = pVVar4;
  iVar9 = pCounts[8];
  iVar12 = iVar9 * 6;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  if (iVar9 * 6 - 1U < 0xf) {
    iVar12 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar12;
  if (iVar12 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vLut6s = pVVar4;
  pVVar6 = (Vec_Wrd_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar12 = iVar9;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar12;
  if (iVar12 == 0) {
    pwVar7 = (word *)0x0;
  }
  else {
    pwVar7 = (word *)malloc((long)iVar12 << 3);
  }
  pVVar6->pArray = pwVar7;
  pGVar2->vLut6TTs = pVVar6;
  iVar12 = pCounts[9];
  iVar10 = iVar12 * 5;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  if (iVar12 * 5 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vBoxes = pVVar4;
  iVar10 = pCounts[10];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar11 = iVar10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 * 4);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vDelays = pVVar4;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  if (iVar10 - 1U < 7) {
    iVar10 = 8;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar8->pArray = pVVar4;
  pGVar2->vDelayIns = pVVar8;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar8->pArray = pVVar4;
  pGVar2->vDelayOuts = pVVar8;
  iVar10 = pCounts[2];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  if (iVar10 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderPis = pVVar4;
  iVar10 = pCounts[3];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar13 = iVar10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderPos = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar10 = iVar12;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderBoxes = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderDelays = pVVar4;
  iVar10 = pCounts[4];
  iVar12 = iVar9 + iVar1 + iVar10 * 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  if ((iVar9 + iVar1 + iVar10 * 2) - 1U < 0xf) {
    iVar12 = 0x10;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar12;
  if (iVar12 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderLuts = pVVar4;
  iVar1 = pCounts[5];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar4->pArray = piVar5;
  pGVar2->vOrderSeqs = pVVar4;
  return pGVar2;
}

Assistant:

Gls_Man_t * Gls_ManAlloc( Vec_Str_t * vLines, int * pCounts )
{
    Gls_Man_t * p = ABC_CALLOC( Gls_Man_t, 1 );
    p->vLines     = vLines;
    p->vTypes     = Vec_StrStart( Vec_StrSize(vLines)+100 ); 
    p->vIndexes   = Vec_IntStart( Vec_StrSize(vLines)+100 ); 
    p->vLut4s     = Vec_IntAlloc( 4 * pCounts[GLS_LUT4] );
    p->vLut4TTs   = Vec_IntAlloc( pCounts[GLS_LUT4] );
    p->vLut6s     = Vec_IntAlloc( 6 * pCounts[GLS_LUT6] );
    p->vLut6TTs   = Vec_WrdAlloc( pCounts[GLS_LUT6] );
    p->vBoxes     = Vec_IntAlloc( 5 * pCounts[GLS_BOX] );
    p->vDelays    = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vDelayIns  = Vec_WecAlloc( pCounts[GLS_DEL] );
    p->vDelayOuts = Vec_WecAlloc( pCounts[GLS_DEL] );
    // ordering
    p->vOrderPis    = Vec_IntAlloc( pCounts[GLS_PI] );
    p->vOrderPos    = Vec_IntAlloc( pCounts[GLS_PO] );
    p->vOrderBoxes  = Vec_IntAlloc( pCounts[GLS_BOX] );
    p->vOrderDelays = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vOrderLuts   = Vec_IntAlloc( pCounts[GLS_LUT4] + pCounts[GLS_LUT6] + 2*pCounts[GLS_BAR] );
    p->vOrderSeqs   = Vec_IntAlloc( pCounts[GLS_SEQ] );
    return p;
}